

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O0

void __thiscall
basisu::basisu_frontend::dump_endpoint_clusterization_visualization
          (basisu_frontend *this,char *pFilename,bool vis_endpoint_colors)

{
  uint a;
  bool bVar1;
  uint32_t uVar2;
  vector<unsigned_int> *pvVar3;
  uint *puVar4;
  etc_block *this_00;
  pixel_block *this_01;
  basisu_frontend *pbVar5;
  byte in_DL;
  char *in_RSI;
  long in_RDI;
  uint32_t i_4;
  uint32_t i_3;
  color_rgba colors [2];
  color_rgba subblock_pixels [8];
  color_rgba *pBlock_pixels;
  etc_block *blk2;
  uint32_t subblock_index;
  uint32_t block_index;
  uint32_t training_vector_index;
  uint32_t subblock_iter;
  uint32_t i_2;
  color_rgba blk_colors [4];
  etc_block blk;
  uint32_t cluster_iter;
  uint32_t unsorted_cluster_iter;
  image endpoint_cluster_vis;
  uint32_t i_1;
  uint32_t i;
  vector<unsigned_int> sorted_cluster_indices;
  vector<unsigned_int> cluster_sizes;
  uint32_t max_endpoint_cluster_size;
  uint32_t in_stack_fffffffffffffdd8;
  undefined2 in_stack_fffffffffffffddc;
  undefined1 in_stack_fffffffffffffdde;
  undefined1 in_stack_fffffffffffffddf;
  basisu_frontend *in_stack_fffffffffffffde0;
  uint32_t in_stack_fffffffffffffde8;
  uint32_t in_stack_fffffffffffffdec;
  color_rgba *in_stack_fffffffffffffdf0;
  color_rgba *in_stack_fffffffffffffdf8;
  image *in_stack_fffffffffffffe00;
  anon_union_4_2_6eba8969_for_color_rgba_0 *local_1e8;
  vector<unsigned_int> *in_stack_fffffffffffffe40;
  uint32_t in_stack_fffffffffffffe48;
  uint in_stack_fffffffffffffe4c;
  vector<unsigned_int> *in_stack_fffffffffffffe50;
  color_rgba *local_198;
  uint uVar6;
  uint local_f8;
  uint local_f4;
  color_rgba local_f0 [2];
  anon_union_4_2_6eba8969_for_color_rgba_0 local_e8 [8];
  anon_union_4_2_6eba8969_for_color_rgba_0 aaStack_c8 [2];
  basisu_frontend *local_c0;
  etc_block *local_b8;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  color_rgba local_98 [4];
  color_rgba acStack_88 [2];
  etc_block local_80;
  uint local_78;
  uint local_74;
  image local_70;
  uint local_50;
  undefined4 local_4c;
  uint local_48;
  uint local_18;
  byte local_11;
  char *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  debug_printf("dump_endpoint_clusterization_visualization\n");
  local_18 = 0;
  vector<basisu::vector<unsigned_int>_>::size
            ((vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0xc0));
  vector<unsigned_int>::vector
            ((vector<unsigned_int> *)in_stack_fffffffffffffde0,
             CONCAT17(in_stack_fffffffffffffddf,
                      CONCAT16(in_stack_fffffffffffffdde,
                               CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8))));
  vector<basisu::vector<unsigned_int>_>::size
            ((vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0xc0));
  vector<unsigned_int>::vector
            ((vector<unsigned_int> *)in_stack_fffffffffffffde0,
             CONCAT17(in_stack_fffffffffffffddf,
                      CONCAT16(in_stack_fffffffffffffdde,
                               CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8))));
  for (local_48 = 0; uVar6 = local_48,
      uVar2 = vector<basisu::vector<unsigned_int>_>::size
                        ((vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0xc0)), a = local_18,
      uVar6 < uVar2; local_48 = local_48 + 1) {
    pvVar3 = vector<basisu::vector<unsigned_int>_>::operator[]
                       ((vector<basisu::vector<unsigned_int>_> *)in_stack_fffffffffffffde0,
                        CONCAT17(in_stack_fffffffffffffddf,
                                 CONCAT16(in_stack_fffffffffffffdde,
                                          CONCAT24(in_stack_fffffffffffffddc,
                                                   in_stack_fffffffffffffdd8))));
    uVar2 = vector<unsigned_int>::size(pvVar3);
    local_18 = maximum<unsigned_int>(a,uVar2);
    pvVar3 = vector<basisu::vector<unsigned_int>_>::operator[]
                       ((vector<basisu::vector<unsigned_int>_> *)in_stack_fffffffffffffde0,
                        CONCAT17(in_stack_fffffffffffffddf,
                                 CONCAT16(in_stack_fffffffffffffdde,
                                          CONCAT24(in_stack_fffffffffffffddc,
                                                   in_stack_fffffffffffffdd8))));
    uVar2 = vector<unsigned_int>::size(pvVar3);
    puVar4 = vector<unsigned_int>::operator[]
                       ((vector<unsigned_int> *)in_stack_fffffffffffffde0,
                        CONCAT17(in_stack_fffffffffffffddf,
                                 CONCAT16(in_stack_fffffffffffffdde,
                                          CONCAT24(in_stack_fffffffffffffddc,
                                                   in_stack_fffffffffffffdd8))));
    *puVar4 = uVar2;
  }
  if (local_18 == 0) {
    local_4c = 1;
  }
  else {
    for (local_50 = 0; uVar6 = local_50,
        uVar2 = vector<basisu::vector<unsigned_int>_>::size
                          ((vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0xc0)), uVar6 < uVar2;
        local_50 = local_50 + 1) {
      uVar6 = local_50;
      puVar4 = vector<unsigned_int>::operator[]
                         ((vector<unsigned_int> *)in_stack_fffffffffffffde0,
                          CONCAT17(in_stack_fffffffffffffddf,
                                   CONCAT16(in_stack_fffffffffffffdde,
                                            CONCAT24(in_stack_fffffffffffffddc,
                                                     in_stack_fffffffffffffdd8))));
      *puVar4 = uVar6;
    }
    minimum<unsigned_int>(local_18,0x800);
    vector<basisu::vector<unsigned_int>_>::size
              ((vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0xc0));
    image::image(in_stack_fffffffffffffe00,(uint32_t)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                 (uint32_t)in_stack_fffffffffffffdf8,
                 (uint32_t)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
    for (local_74 = 0; uVar6 = local_74,
        uVar2 = vector<basisu::vector<unsigned_int>_>::size
                          ((vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0xc0)), uVar6 < uVar2;
        local_74 = local_74 + 1) {
      puVar4 = vector<unsigned_int>::operator[]
                         ((vector<unsigned_int> *)in_stack_fffffffffffffde0,
                          CONCAT17(in_stack_fffffffffffffddf,
                                   CONCAT16(in_stack_fffffffffffffdde,
                                            CONCAT24(in_stack_fffffffffffffddc,
                                                     in_stack_fffffffffffffdd8))));
      local_78 = *puVar4;
      etc_block::clear((etc_block *)0x4e33fb);
      etc_block::set_flip_bit(&local_80,false);
      etc_block::set_diff_bit(&local_80,true);
      vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[]
                ((vector<basisu::basisu_frontend::endpoint_cluster_etc_params> *)
                 in_stack_fffffffffffffde0,
                 CONCAT17(in_stack_fffffffffffffddf,
                          CONCAT16(in_stack_fffffffffffffdde,
                                   CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8))));
      etc_block::set_inten_tables_etc1s
                ((etc_block *)in_stack_fffffffffffffde0,
                 CONCAT13(in_stack_fffffffffffffddf,
                          CONCAT12(in_stack_fffffffffffffdde,in_stack_fffffffffffffddc)));
      vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[]
                ((vector<basisu::basisu_frontend::endpoint_cluster_etc_params> *)
                 in_stack_fffffffffffffde0,
                 CONCAT17(in_stack_fffffffffffffddf,
                          CONCAT16(in_stack_fffffffffffffdde,
                                   CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8))));
      etc_block::pack_color5
                ((color_rgba *)in_stack_fffffffffffffde0,(bool)in_stack_fffffffffffffddf,
                 in_stack_fffffffffffffdd8);
      etc_block::set_base5_color
                ((etc_block *)in_stack_fffffffffffffde0,
                 CONCAT11(in_stack_fffffffffffffddf,in_stack_fffffffffffffdde));
      local_198 = local_98;
      do {
        color_rgba::color_rgba(local_198);
        local_198 = local_198 + 1;
      } while (local_198 != acStack_88);
      etc_block::get_block_colors
                ((etc_block *)in_stack_fffffffffffffe50,
                 (color_rgba *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                 (uint32_t)((ulong)in_stack_fffffffffffffe40 >> 0x20));
      for (local_9c = 0; local_9c < 4; local_9c = local_9c + 1) {
        image::fill_box(in_stack_fffffffffffffe00,
                        (uint32_t)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                        (uint32_t)in_stack_fffffffffffffdf8,
                        (uint32_t)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
                        (uint32_t)in_stack_fffffffffffffdf0,
                        (color_rgba *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8))
        ;
      }
      local_a0 = 0;
      while( true ) {
        in_stack_fffffffffffffe4c = local_a0;
        in_stack_fffffffffffffe50 =
             vector<basisu::vector<unsigned_int>_>::operator[]
                       ((vector<basisu::vector<unsigned_int>_> *)in_stack_fffffffffffffde0,
                        CONCAT17(in_stack_fffffffffffffddf,
                                 CONCAT16(in_stack_fffffffffffffdde,
                                          CONCAT24(in_stack_fffffffffffffddc,
                                                   in_stack_fffffffffffffdd8))));
        in_stack_fffffffffffffe48 = vector<unsigned_int>::size(in_stack_fffffffffffffe50);
        if (in_stack_fffffffffffffe48 <= in_stack_fffffffffffffe4c) break;
        in_stack_fffffffffffffe40 =
             vector<basisu::vector<unsigned_int>_>::operator[]
                       ((vector<basisu::vector<unsigned_int>_> *)in_stack_fffffffffffffde0,
                        CONCAT17(in_stack_fffffffffffffddf,
                                 CONCAT16(in_stack_fffffffffffffdde,
                                          CONCAT24(in_stack_fffffffffffffddc,
                                                   in_stack_fffffffffffffdd8))));
        puVar4 = vector<unsigned_int>::operator[]
                           ((vector<unsigned_int> *)in_stack_fffffffffffffde0,
                            CONCAT17(in_stack_fffffffffffffddf,
                                     CONCAT16(in_stack_fffffffffffffdde,
                                              CONCAT24(in_stack_fffffffffffffddc,
                                                       in_stack_fffffffffffffdd8))));
        local_a4 = *puVar4;
        local_a8 = local_a4 >> 1;
        local_ac = local_a4 & 1;
        this_00 = vector<basisu::etc_block>::operator[]
                            ((vector<basisu::etc_block> *)in_stack_fffffffffffffde0,
                             CONCAT17(in_stack_fffffffffffffddf,
                                      CONCAT16(in_stack_fffffffffffffdde,
                                               CONCAT24(in_stack_fffffffffffffddc,
                                                        in_stack_fffffffffffffdd8))));
        local_b8 = this_00;
        this_01 = get_source_pixel_block
                            (in_stack_fffffffffffffde0,
                             CONCAT13(in_stack_fffffffffffffddf,
                                      CONCAT12(in_stack_fffffffffffffdde,in_stack_fffffffffffffddc))
                            );
        pbVar5 = (basisu_frontend *)pixel_block::get_ptr(this_01);
        local_1e8 = &local_f0[2].field_0;
        local_c0 = pbVar5;
        do {
          color_rgba::color_rgba((color_rgba *)&local_1e8->field_1);
          local_1e8 = local_1e8 + 1;
        } while (local_1e8 != aaStack_c8);
        if ((local_11 & 1) == 0) {
          for (local_f8 = 0; local_f8 < 8; local_f8 = local_f8 + 1) {
            in_stack_fffffffffffffde0 = local_c0;
            bVar1 = etc_block::get_flip_bit(local_b8);
            in_stack_fffffffffffffdec = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdec);
            aaStack_c8[(ulong)local_f8 - 8] =
                 ((anon_union_4_2_6eba8969_for_color_rgba_0 *)&in_stack_fffffffffffffde0->m_params)
                 [*(uint *)(g_etc1_pixel_indices +
                           (ulong)local_f8 * 4 + (ulong)local_ac * 0x20 + (ulong)bVar1 * 0x40)];
          }
        }
        else {
          in_stack_fffffffffffffdf8 = local_f0 + 2;
          in_stack_fffffffffffffe00 = (image *)local_f0;
          do {
            in_stack_fffffffffffffdf0 = (color_rgba *)in_stack_fffffffffffffe00;
            color_rgba::color_rgba(in_stack_fffffffffffffdf0);
            in_stack_fffffffffffffe00 = (image *)(in_stack_fffffffffffffdf0 + 1);
          } while (in_stack_fffffffffffffe00 != (image *)in_stack_fffffffffffffdf8);
          etc_block::get_block_low_high_colors
                    (this_00,(color_rgba *)this_01,(uint32_t)((ulong)pbVar5 >> 0x20));
          for (local_f4 = 0; local_f4 < 8; local_f4 = local_f4 + 1) {
            aaStack_c8[(ulong)local_f4 - 8] = aaStack_c8[(ulong)local_ac - 10];
          }
        }
        image::set_block_clipped
                  (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                   (uint32_t)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
                   (uint32_t)in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,
                   in_stack_fffffffffffffde8);
        local_a0 = local_a0 + 1;
      }
    }
    save_png(local_10,&local_70,0,0);
    debug_printf("Wrote debug visualization file %s\n",local_10);
    image::~image((image *)0x4e3927);
    local_4c = 0;
  }
  vector<unsigned_int>::~vector((vector<unsigned_int> *)in_stack_fffffffffffffde0);
  vector<unsigned_int>::~vector((vector<unsigned_int> *)in_stack_fffffffffffffde0);
  return;
}

Assistant:

void basisu_frontend::dump_endpoint_clusterization_visualization(const char *pFilename, bool vis_endpoint_colors)
	{
		debug_printf("dump_endpoint_clusterization_visualization\n");

		uint32_t max_endpoint_cluster_size = 0;

		basisu::vector<uint32_t> cluster_sizes(m_endpoint_clusters.size());
		basisu::vector<uint32_t> sorted_cluster_indices(m_endpoint_clusters.size());
		for (uint32_t i = 0; i < m_endpoint_clusters.size(); i++)
		{
			max_endpoint_cluster_size = maximum<uint32_t>(max_endpoint_cluster_size, (uint32_t)m_endpoint_clusters[i].size());
			cluster_sizes[i] = (uint32_t)m_endpoint_clusters[i].size();
		}

		if (!max_endpoint_cluster_size)
			return;

		for (uint32_t i = 0; i < m_endpoint_clusters.size(); i++)
			sorted_cluster_indices[i] = i;

		//indexed_heap_sort(endpoint_clusters.size(), cluster_sizes.get_ptr(), sorted_cluster_indices.get_ptr());

		image endpoint_cluster_vis(12 + minimum<uint32_t>(max_endpoint_cluster_size, 2048) * 5, (uint32_t)m_endpoint_clusters.size() * 3);

		for (uint32_t unsorted_cluster_iter = 0; unsorted_cluster_iter < m_endpoint_clusters.size(); unsorted_cluster_iter++)
		{
			const uint32_t cluster_iter = sorted_cluster_indices[unsorted_cluster_iter];

			etc_block blk;
			blk.clear();
			blk.set_flip_bit(false);
			blk.set_diff_bit(true);
			blk.set_inten_tables_etc1s(m_endpoint_cluster_etc_params[cluster_iter].m_inten_table[0]);
			blk.set_base5_color(etc_block::pack_color5(m_endpoint_cluster_etc_params[cluster_iter].m_color_unscaled[0], false));

			color_rgba blk_colors[4];
			blk.get_block_colors(blk_colors, 0);
			for (uint32_t i = 0; i < 4; i++)
				endpoint_cluster_vis.fill_box(i * 2, 3 * unsorted_cluster_iter, 2, 2, blk_colors[i]);

			for (uint32_t subblock_iter = 0; subblock_iter < m_endpoint_clusters[cluster_iter].size(); subblock_iter++)
			{
				uint32_t training_vector_index = m_endpoint_clusters[cluster_iter][subblock_iter];

				const uint32_t block_index = training_vector_index >> 1;
				const uint32_t subblock_index = training_vector_index & 1;

				const etc_block& blk2 = m_etc1_blocks_etc1s[block_index];

				const color_rgba *pBlock_pixels = get_source_pixel_block(block_index).get_ptr();

				color_rgba subblock_pixels[8];

				if (vis_endpoint_colors)
				{
					color_rgba colors[2];
					blk2.get_block_low_high_colors(colors, subblock_index);
					for (uint32_t i = 0; i < 8; i++)
						subblock_pixels[i] = colors[subblock_index];
				}
				else
				{
					for (uint32_t i = 0; i < 8; i++)
						subblock_pixels[i] = pBlock_pixels[g_etc1_pixel_indices[blk2.get_flip_bit()][subblock_index][i]];
				}

				endpoint_cluster_vis.set_block_clipped(subblock_pixels, 12 + 5 * subblock_iter, 3 * unsorted_cluster_iter, 4, 2);
			}
		}

		save_png(pFilename, endpoint_cluster_vis);
		debug_printf("Wrote debug visualization file %s\n", pFilename);
	}